

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceFaceCountQuantity::SurfaceFaceCountQuantity
          (SurfaceFaceCountQuantity *this,string *name,
          vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          *values_,SurfaceMesh *mesh_)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  mapped_type_conflict mVar4;
  SurfaceMesh *pSVar5;
  pointer ppVar6;
  pointer pvVar7;
  long lVar8;
  long lVar9;
  pointer pvVar10;
  undefined1 auVar11 [16];
  mapped_type_conflict *pmVar12;
  iterator iVar13;
  long lVar14;
  long lVar15;
  pair<unsigned_long,_int> *t;
  pointer ppVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  ulong local_d0;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *local_c8;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *local_c0;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  m;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> newValues;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::__cxx11::string::string((string *)&local_70,"face count",(allocator *)&m);
  SurfaceCountQuantity::SurfaceCountQuantity
            (&this->super_SurfaceCountQuantity,&local_50,mesh_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  local_c8 = &this->values;
  (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
  super_Quantity<polyscope::SurfaceMesh>._vptr_Quantity =
       (_func_int **)&PTR__SurfaceFaceCountQuantity_0047de38;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar5 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
           super_Quantity<polyscope::SurfaceMesh>.parent;
  if ((pSVar5->facePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pSVar5->facePerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    p_Var1 = &m._M_t._M_impl.super__Rb_tree_header;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVar6 = (values_->
             super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar16 = (values_->
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_c0 = values_;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; ppVar16 != ppVar6; ppVar16 = ppVar16 + 1) {
      mVar4 = ppVar16->second;
      pmVar12 = std::
                map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                ::operator[](&m,&ppVar16->first);
      *pmVar12 = mVar4;
    }
    local_d0 = 0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      values_ = local_c0;
      pSVar5 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
               super_Quantity<polyscope::SurfaceMesh>.parent;
      if ((ulong)(((long)(pSVar5->faces).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar5->faces).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_d0) break;
      iVar13 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
               ::find(&m._M_t,(pSVar5->facePerm).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_d0);
      if ((_Rb_tree_header *)iVar13._M_node != p_Var1) {
        pmVar12 = std::
                  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                                *)&m._M_t,
                               (((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                                 super_Quantity<polyscope::SurfaceMesh>.parent)->facePerm).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_d0);
        std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
        emplace_back<unsigned_long&,int&>
                  ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                    *)&newValues,&local_d0,pmVar12);
      }
      local_d0 = local_d0 + 1;
    }
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    operator=(local_c0,&newValues);
    std::
    _Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    ~_Vector_base(&newValues.
                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 );
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::~_Rb_tree(&m._M_t);
  }
  ppVar6 = (values_->
           super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar16 = (values_->
                 super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar6;
      ppVar16 = ppVar16 + 1) {
    mVar4 = ppVar16->second;
    pmVar12 = std::
              map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
              ::operator[](local_c8,&ppVar16->first);
    *pmVar12 = mVar4;
    fVar17 = 0.0;
    pSVar5 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
             super_Quantity<polyscope::SurfaceMesh>.parent;
    pvVar7 = (pSVar5->faces).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = *(long *)&pvVar7[ppVar16->first].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    lVar14 = (long)*(pointer *)
                    ((long)&pvVar7[ppVar16->first].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8) - lVar8 >> 3;
    auVar18 = ZEXT816(0) << 0x40;
    for (lVar15 = 0; lVar14 != lVar15; lVar15 = lVar15 + 1) {
      lVar9 = *(long *)(lVar8 + lVar15 * 8);
      pvVar10 = (pSVar5->vertices).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      fVar17 = fVar17 + pvVar10[lVar9].field_2.z;
      pvVar10 = pvVar10 + lVar9;
      uVar2 = pvVar10->field_0;
      uVar3 = pvVar10->field_1;
      auVar19._0_4_ = auVar18._0_4_ + (float)uVar2;
      auVar19._4_4_ = auVar18._4_4_ + (float)uVar3;
      auVar19._8_4_ = auVar18._8_4_ + 0.0;
      auVar19._12_4_ = auVar18._12_4_ + 0.0;
      auVar18 = auVar19;
    }
    auVar11._8_8_ = in_XMM4_Qb;
    auVar11._0_8_ = in_XMM4_Qa;
    auVar11 = vcvtusi2sd_avx512f(auVar11,lVar14);
    fVar20 = (float)auVar11._0_8_;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)(fVar17 / fVar20);
    auVar21._4_4_ = fVar20;
    auVar21._0_4_ = fVar20;
    auVar21._8_4_ = fVar20;
    auVar21._12_4_ = fVar20;
    auVar18 = vdivps_avx(auVar18,auVar21);
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)(double)ppVar16->second;
    m._M_t._M_impl._0_8_ = vmovlps_avx(auVar18);
    std::
    vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
    ::emplace_back<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>
              ((vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
                *)&(this->super_SurfaceCountQuantity).entries,
               (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)&m);
  }
  SurfaceCountQuantity::initializeLimits(&this->super_SurfaceCountQuantity);
  return;
}

Assistant:

SurfaceFaceCountQuantity::SurfaceFaceCountQuantity(std::string name, std::vector<std::pair<size_t, int>> values_,
                                                   SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "face count") {

  // Apply permutation if needed
  if (parent.facePerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, int> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, int>> newValues;
    for (size_t iP = 0; iP < parent.nFaces(); iP++) {
      if (m.find(parent.facePerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.facePerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;

    size_t iF = t.first;
    auto& face = parent.faces[iF];
    size_t D = face.size();
    glm::vec3 faceCenter = glm::vec3{0., 0., 0.};
    for (size_t j = 0; j < D; j++) {
      faceCenter += parent.vertices[face[j]];
    }
    faceCenter /= static_cast<double>(D);

    entries.push_back(std::make_pair(faceCenter, t.second));
  }

  initializeLimits();
}